

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_InvalidOptionNumber_Test::TestBody
          (CoapTest_CoapMessageOptions_InvalidOptionNumber_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  ByteArray buffer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  undefined8 *local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  _Base_ptr local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_60._0_4_ = 0x40;
  local_60[4] = 0;
  __l._M_len = 5;
  __l._M_array = local_70 + 0x10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_38,__l,(allocator_type *)local_70);
  local_60._0_4_ = 0;
  local_50 = (_Base_ptr)0x0;
  local_48._M_local_buf[0] = '\0';
  local_60._8_8_ = &local_48;
  Message::Deserialize((Message *)local_70,(Error *)(local_70 + 0x10),&local_38);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            (local_80,"message","nullptr",(shared_ptr<ot::commissioner::coap::Message> *)local_70,
             &local_90._M_head_impl);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar2 = (char *)*local_78;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  puVar1 = local_78;
  if (local_78 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_78 != local_78 + 2) {
      operator_delete((undefined8 *)*local_78);
    }
    operator_delete(puVar1);
  }
  local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            (local_80,"error","ErrorCode::kNone",(Error *)(local_70 + 0x10),(ErrorCode *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar2 = (char *)*local_78;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  puVar1 = local_78;
  if (local_78 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_78 != local_78 + 2) {
      operator_delete((undefined8 *)*local_78);
    }
    operator_delete(puVar1);
  }
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((map<ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
          *)(local_70._0_8_ + 0x10))->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_88.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_80,"message->GetOptionNum()","0",(unsigned_long *)&local_90,(int *)&local_88);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar2 = (char *)*local_78;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_78 != local_78 + 2) {
      operator_delete((undefined8 *)*local_78);
    }
    operator_delete(local_78);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._8_8_ != &local_48) {
    operator_delete((void *)local_60._8_8_);
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_InvalidOptionNumber)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00, 0x00};
    Error     error;

    auto message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 0);
}